

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_x86_avx512fp16.cpp
# Opt level: O2

void ncnn::cast_fp16_to_fp32_sse_avx512fp16(Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  undefined1 (*pauVar5) [32];
  long lVar6;
  undefined1 (*pauVar7) [64];
  undefined1 auVar8 [16];
  undefined1 auVar9 [32];
  undefined1 auVar10 [64];
  float fVar11;
  
  iVar3 = bottom_blob->h * bottom_blob->w * bottom_blob->d * bottom_blob->elempack;
  uVar4 = 0;
  uVar1 = (ulong)(uint)bottom_blob->c;
  if (bottom_blob->c < 1) {
    uVar1 = uVar4;
  }
  for (; uVar4 != uVar1; uVar4 = uVar4 + 1) {
    pauVar5 = (undefined1 (*) [32])
              (bottom_blob->cstep * uVar4 * bottom_blob->elemsize + (long)bottom_blob->data);
    pauVar7 = (undefined1 (*) [64])
              (top_blob->cstep * uVar4 * top_blob->elemsize + (long)top_blob->data);
    for (iVar2 = 0; iVar2 + 0xf < iVar3; iVar2 = iVar2 + 0x10) {
      auVar10 = vcvtph2psx_avx512fp16(*pauVar5);
      *pauVar7 = auVar10;
      pauVar5 = pauVar5 + 1;
      pauVar7 = pauVar7 + 1;
    }
    for (; iVar2 + 7 < iVar3; iVar2 = iVar2 + 8) {
      auVar9 = vcvtph2psx_avx512fp16(*(undefined1 (*) [16])*pauVar5);
      *(undefined1 (*) [32])*pauVar7 = auVar9;
      pauVar5 = (undefined1 (*) [32])(*pauVar5 + 0x10);
      pauVar7 = (undefined1 (*) [64])((long)*pauVar7 + 0x20);
    }
    for (; iVar2 + 3 < iVar3; iVar2 = iVar2 + 4) {
      auVar8._8_8_ = 0;
      auVar8._0_8_ = *(ulong *)*pauVar5;
      auVar8 = vcvtph2psx_avx512fp16(auVar8);
      *(undefined1 (*) [16])*pauVar7 = auVar8;
      pauVar5 = (undefined1 (*) [32])(*pauVar5 + 8);
      pauVar7 = (undefined1 (*) [64])((long)*pauVar7 + 0x10);
    }
    lVar6 = 0;
    for (; iVar2 < iVar3; iVar2 = iVar2 + 1) {
      fVar11 = float16_to_float32(*(unsigned_short *)(*pauVar5 + lVar6));
      *(float *)((long)*pauVar7 + lVar6 * 2) = fVar11;
      lVar6 = lVar6 + 2;
    }
  }
  return;
}

Assistant:

void cast_fp16_to_fp32_sse_avx512fp16(const Mat& bottom_blob, Mat& top_blob, const Option& opt)
{
    cast_fp16_to_fp32_sse(bottom_blob, top_blob, opt);
}